

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O0

HRESULT AutoSystemInfo::GetJscriptFileVersion
                  (DWORD *majorVersion,DWORD *minorVersion,DWORD *buildDateHash,DWORD *buildTimeHash
                  )

{
  LPCWSTR pszPath;
  LPCWSTR jscriptDllName;
  HRESULT hr;
  DWORD *buildTimeHash_local;
  DWORD *buildDateHash_local;
  DWORD *minorVersion_local;
  DWORD *majorVersion_local;
  
  jscriptDllName._4_4_ = -0x7fffbffb;
  if ((Data.majorVersion == 0) && (Data.minorVersion == 0)) {
    pszPath = GetJscriptDllFileName();
    jscriptDllName._4_4_ = GetVersionInfo(pszPath,majorVersion,minorVersion);
    Data.majorVersion = *majorVersion;
    Data.minorVersion = *minorVersion;
  }
  else if (Data.majorVersion != 0xffffffff) {
    *majorVersion = Data.majorVersion;
    *minorVersion = Data.minorVersion;
    jscriptDllName._4_4_ = 0;
  }
  if (buildDateHash != (DWORD *)0x0) {
    *buildDateHash = Data.buildDateHash;
  }
  if (buildTimeHash != (DWORD *)0x0) {
    *buildTimeHash = Data.buildTimeHash;
  }
  return jscriptDllName._4_4_;
}

Assistant:

HRESULT AutoSystemInfo::GetJscriptFileVersion(DWORD* majorVersion, DWORD* minorVersion, DWORD *buildDateHash, DWORD *buildTimeHash)
{
    HRESULT hr = E_FAIL;
    if(AutoSystemInfo::Data.majorVersion == 0 && AutoSystemInfo::Data.minorVersion == 0)
    {
        // uninitialized state  - call the system API to get the version info.
        LPCWSTR jscriptDllName = GetJscriptDllFileName();
        hr = GetVersionInfo(jscriptDllName, majorVersion, minorVersion);

        AutoSystemInfo::Data.majorVersion = *majorVersion;
        AutoSystemInfo::Data.minorVersion = *minorVersion;
    }
    else if(AutoSystemInfo::Data.majorVersion != INVALID_VERSION)
    {
        // if the cached copy is valid, use it and return S_OK.
        *majorVersion = AutoSystemInfo::Data.majorVersion;
        *minorVersion = AutoSystemInfo::Data.minorVersion;
        hr = S_OK;
    }

    if (buildDateHash)
    {
        *buildDateHash = AutoSystemInfo::Data.buildDateHash;
    }

    if (buildTimeHash)
    {
        *buildTimeHash = AutoSystemInfo::Data.buildTimeHash;
    }
    return hr;
}